

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

CEPlanet * CEPlanet::Mars(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::__cxx11::string::string((string *)&local_40,"Mars",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  in_RDI->semi_major_axis_au_ = 1.52371243;
  in_RDI->eccentricity_ = 0.09336511;
  in_RDI->semi_major_axis_au_per_cent_ = 9.7e-07;
  in_RDI->eccentricity_per_cent_ = 9.149e-05;
  in_RDI->inclination_deg_ = 1.85181869;
  in_RDI->mean_longitude_deg_ = -4.56813164;
  in_RDI->inclination_deg_per_cent_ = -0.41525517272563006;
  in_RDI->mean_longitude_deg_per_cent_ = 19140.29934243;
  in_RDI->perihelion_lon_deg_ = -23.91744784;
  in_RDI->ascending_node_lon_deg_ = 49.71320984;
  in_RDI->perihelion_long_deg_per_cent_ = 0.45223625;
  in_RDI->ascending_node_lon_deg_per_cent_ = -0.26852431;
  in_RDI->albedo_ = 0.15;
  in_RDI->radius_m_ = 3389900.0;
  in_RDI->mass_kg_ = 6.4185e+23;
  local_40._M_dataplus._M_p = (pointer)0x4010000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Mars()
{
    CEPlanet mars("Mars", 0.0, 0.0) ;
    mars.SetSemiMajorAxis_AU(1.52371243, 0.00000097) ;
    mars.SetEccentricity(0.09336511, 0.00009149) ;
    mars.SetInclination(1.85181869, -0.00724757, CEAngleType::DEGREES) ;
    mars.SetMeanLongitude(-4.56813164, 19140.29934243, CEAngleType::DEGREES) ;
    mars.SetPerihelionLongitude(-23.91744784, 0.45223625, CEAngleType::DEGREES) ;
    mars.SetAscendingNodeLongitude(49.71320984, -0.26852431, CEAngleType::DEGREES) ;
    
    // Set planetary properties
    mars.SetMeanRadius_m(3389900.0) ;
    mars.SetAlbedo(0.150) ;
    mars.SetMass_kg(6.4185E23) ;
    
    // Set the sofa planet ID
    mars.SetSofaID(4) ;
    
    
    return mars ;
}